

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

LY_ERR lyds_merge_nodes3(lyd_node **first_dst,lyd_node **leader_dst,lyd_meta *root_meta_dst,
                        rb_node *rbt_dst,lyd_node **first_src,lyd_meta *root_meta_src,
                        rb_node *rbt_src,lyd_node **next_p)

{
  rb_node *__dest;
  LY_ERR LVar1;
  LY_ERR ret__;
  lyd_value_lyds_tree *_lt_1;
  anon_union_24_16_e2776397_for_lyd_value_2 *local_60;
  lyd_value_lyds_tree *_lt;
  lyd_node *node;
  rb_node *iter_state;
  rb_node *iter;
  lyd_meta *root_meta_src_local;
  lyd_node **first_src_local;
  rb_node *rbt_dst_local;
  lyd_meta *root_meta_dst_local;
  lyd_node **leader_dst_local;
  lyd_node **first_dst_local;
  
  local_60 = &(root_meta_src->value).field_2;
  local_60->dec64 = 0;
  iter = (rb_node *)root_meta_src;
  root_meta_src_local = (lyd_meta *)first_src;
  first_src_local = (lyd_node **)rbt_dst;
  rbt_dst_local = (rb_node *)root_meta_dst;
  root_meta_dst_local = (lyd_meta *)leader_dst;
  leader_dst_local = first_dst;
  lyd_free_meta_single(root_meta_src);
  iter_state = rb_iter_begin(rbt_src,(rb_node **)&node);
  while (__dest = iter_state, iter_state != (rb_node *)0x0) {
    _lt = (lyd_value_lyds_tree *)iter_state->dnode;
    *next_p = ((lyd_node *)_lt)->next;
    memset(&_lt_1,0,0x28);
    memcpy(__dest,&_lt_1,0x28);
    iter_state->dnode = (lyd_node *)_lt;
    rb_insert_node((rb_node **)&first_src_local,iter_state,(ly_bool *)0x0);
    lyd_unlink_ignore_lyds(&root_meta_src_local->parent,(lyd_node *)_lt);
    lyds_link_data_node(leader_dst_local,&root_meta_dst_local->parent,(lyd_node *)_lt,
                        (lyd_meta *)rbt_dst_local,iter_state);
    lyd_insert_hash((lyd_node *)_lt);
    iter_state = rb_iter_next((rb_node **)&node);
  }
  if ((*next_p == (lyd_node *)0x0) || ((*next_p)->schema != root_meta_dst_local->parent->schema)) {
    rbt_dst_local[1].left = (rb_node *)first_src_local;
  }
  else {
    LVar1 = lyds_merge_nodes1(leader_dst_local,&root_meta_dst_local->parent,
                              (lyd_meta *)rbt_dst_local,(rb_node *)first_src_local,
                              &root_meta_src_local->parent,*next_p,next_p);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyds_merge_nodes3(struct lyd_node **first_dst, struct lyd_node **leader_dst, struct lyd_meta *root_meta_dst,
        struct rb_node *rbt_dst, struct lyd_node **first_src, struct lyd_meta *root_meta_src,
        struct rb_node *rbt_src, struct lyd_node **next_p)
{
    struct rb_node *iter, *iter_state;
    struct lyd_node *node;

    /* release source RB tree */
    RBT_SET(root_meta_src, NULL);
    lyd_free_meta_single(root_meta_src);

    /* 'randomly' iterate over all source nodes, merge and move to the destination */
    for (iter = rb_iter_begin(rbt_src, &iter_state); iter; iter = rb_iter_next(&iter_state)) {
        node = RBN_DNODE(iter);
        *next_p = node->next;
        RBN_RESET(iter, node);
        rb_insert_node(&rbt_dst, iter, NULL);
        lyd_unlink_ignore_lyds(first_src, node);
        lyds_link_data_node(first_dst, leader_dst, node, root_meta_dst, iter);
        lyd_insert_hash(node);
    }

    if (!*next_p || ((*next_p)->schema != (*leader_dst)->schema)) {
        RBT_SET(root_meta_dst, rbt_dst);
    } else {
        LY_CHECK_RET(lyds_merge_nodes1(first_dst, leader_dst, root_meta_dst, rbt_dst, first_src, *next_p, next_p));
    }

    return LY_SUCCESS;
}